

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.h
# Opt level: O0

void __thiscall
testinator::TestRegistry::Register(TestRegistry *this,Test *test,string *testName,string *suiteName)

{
  result_type_conflict rVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_bool>
  pVar2;
  pair<std::_Rb_tree_iterator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar3;
  undefined1 local_1498 [8];
  random_device rd;
  pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  _Base_ptr local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
  local_d0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  _Base_ptr local_70;
  undefined1 local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
  local_50;
  string *local_28;
  string *suiteName_local;
  string *testName_local;
  Test *test_local;
  TestRegistry *this_local;
  
  local_28 = suiteName;
  suiteName_local = testName;
  testName_local = (string *)test;
  test_local = (Test *)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
  ::pair<testinator::Test_*&,_true>(&local_50,testName,(Test **)&testName_local);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          ::insert(&this->m_tests,&local_50);
  local_70 = (_Base_ptr)pVar2.first._M_node;
  local_68 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
  ::~pair(&local_50);
  std::
  pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<testinator::Test_*&,_true>(&local_98,(Test **)&testName_local,suiteName_local);
  pVar3 = std::
          map<testinator::Test_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::insert(&this->m_testNames,&local_98);
  local_a8 = (_Base_ptr)pVar3.first._M_node;
  local_a0 = pVar3.second;
  std::
  pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_98);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
  ::pair<testinator::Test_*&,_true>(&local_d0,local_28,(Test **)&testName_local);
  local_d8 = (_Base_ptr)
             std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
             ::insert(&this->m_testsBySuite,&local_d0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
  ::~pair(&local_d0);
  std::
  pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<testinator::Test_*&,_true>(&local_100,(Test **)&testName_local,local_28);
  pVar3 = std::
          map<testinator::Test_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::insert(&this->m_suiteNames,&local_100);
  rd.field_0._M_mt._M_p = (size_t)pVar3.first._M_node;
  std::
  pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_100);
  std::random_device::random_device((random_device *)local_1498);
  rVar1 = std::random_device::operator()((random_device *)local_1498);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&this->m_generator,(ulong)rVar1);
  std::random_device::~random_device((random_device *)local_1498);
  return;
}

Assistant:

void Register(Test* test,
                  const std::string& testName,
                  const std::string& suiteName)
    {
      m_tests.insert({testName, test});
      m_testNames.insert({test, testName});

      m_testsBySuite.insert({suiteName, test});
      m_suiteNames.insert({test, suiteName});

      std::random_device rd;
      m_generator.seed(rd());
    }